

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O0

bool __thiscall
vkt::synchronization::anon_unknown_0::MultiQueues::getFreeQueue
          (MultiQueues *this,deUint32 *returnQueueFamilyIndex,VkQueue *returnQueues,
          int *returnQueueIndex)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  deUint32 *pdVar4;
  size_type sVar5;
  reference ppVVar6;
  reference local_68;
  reference local_58;
  int local_44;
  mapped_type *pmStack_40;
  int queueNdx;
  Queues *queue;
  int *piStack_30;
  int queueFamilyIndexNdx;
  int *returnQueueIndex_local;
  VkQueue *returnQueues_local;
  deUint32 *returnQueueFamilyIndex_local;
  MultiQueues *this_local;
  
  queue._4_4_ = 0;
  piStack_30 = returnQueueIndex;
  returnQueueIndex_local = (int *)returnQueues;
  returnQueues_local = (VkQueue *)returnQueueFamilyIndex;
  returnQueueFamilyIndex_local = (deUint32 *)this;
  do {
    iVar1 = queue._4_4_;
    sVar3 = std::
            map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType>_>_>
            ::size(&this->m_queues);
    if ((int)sVar3 <= iVar1) {
      return false;
    }
    pdVar4 = getQueueFamilyIndex(this,queue._4_4_);
    pmStack_40 = std::
                 map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType>_>_>
                 ::operator[](&this->m_queues,pdVar4);
    for (local_44 = 0; iVar1 = local_44,
        sVar5 = std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::size
                          (&pmStack_40->queues), iVar1 < (int)sVar5; local_44 = local_44 + 1) {
      de::Mutex::lock(&this->m_mutex);
      local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&pmStack_40->available,(long)local_44);
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_58);
      if (bVar2) {
        local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&pmStack_40->available,(long)local_44);
        std::_Bit_reference::operator=(&local_68,false);
        pdVar4 = getQueueFamilyIndex(this,queue._4_4_);
        *(deUint32 *)returnQueues_local = *pdVar4;
        ppVVar6 = std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::operator[]
                            (&pmStack_40->queues,(long)local_44);
        *(value_type *)returnQueueIndex_local = *ppVVar6;
        *piStack_30 = local_44;
        de::Mutex::unlock(&this->m_mutex);
        return true;
      }
      de::Mutex::unlock(&this->m_mutex);
    }
    queue._4_4_ = queue._4_4_ + 1;
  } while( true );
}

Assistant:

bool			getFreeQueue			(deUint32& returnQueueFamilyIndex, VkQueue& returnQueues, int& returnQueueIndex)
	{
		for (int queueFamilyIndexNdx = 0 ; queueFamilyIndexNdx < static_cast<int>(m_queues.size()); ++queueFamilyIndexNdx)
		{
			Queues& queue = m_queues[getQueueFamilyIndex(queueFamilyIndexNdx)];
			for (int queueNdx = 0; queueNdx < static_cast<int>(queue.queues.size()); ++queueNdx)
			{
				m_mutex.lock();
				if (queue.available[queueNdx])
				{
					queue.available[queueNdx]	= false;
					returnQueueFamilyIndex		= getQueueFamilyIndex(queueFamilyIndexNdx);
					returnQueues				= queue.queues[queueNdx];
					returnQueueIndex			= queueNdx;
					m_mutex.unlock();
					return true;
				}
				m_mutex.unlock();
			}
		}
		return false;
	}